

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int ipv6_cb(char *elem,size_t len,void *usr)

{
  int iVar1;
  IPV6_STAT *s;
  void *usr_local;
  size_t len_local;
  char *elem_local;
  
  if (*(int *)((long)usr + 0x10) == 0x10) {
    return 0;
  }
  if (len == 0) {
    if (*(int *)((long)usr + 0x14) == -1) {
      *(undefined4 *)((long)usr + 0x14) = *(undefined4 *)((long)usr + 0x10);
    }
    else if (*(int *)((long)usr + 0x14) != *(int *)((long)usr + 0x10)) {
      return 0;
    }
    if (2 < *(int *)((long)usr + 0x18)) {
      return 0;
    }
    *(int *)((long)usr + 0x18) = *(int *)((long)usr + 0x18) + 1;
  }
  else if (len < 5) {
    iVar1 = ipv6_hex((uint8_t *)((long)usr + (long)*(int *)((long)usr + 0x10)),elem,len);
    if (iVar1 == 0) {
      return 0;
    }
    *(int *)((long)usr + 0x10) = *(int *)((long)usr + 0x10) + 2;
  }
  else {
    if (0xc < *(int *)((long)usr + 0x10)) {
      return 0;
    }
    if (elem[len] != '\0') {
      return 0;
    }
    iVar1 = ipv4_from_asc((uint8_t *)((long)usr + (long)*(int *)((long)usr + 0x10)),elem);
    if (iVar1 == 0) {
      return 0;
    }
    *(int *)((long)usr + 0x10) = *(int *)((long)usr + 0x10) + 4;
  }
  return 1;
}

Assistant:

static int ipv6_cb(const char *elem, size_t len, void *usr) {
  IPV6_STAT *s = reinterpret_cast<IPV6_STAT *>(usr);
  // Error if 16 bytes written
  if (s->total == 16) {
    return 0;
  }
  if (len == 0) {
    // Zero length element, corresponds to '::'
    if (s->zero_pos == -1) {
      s->zero_pos = s->total;
    } else if (s->zero_pos != s->total) {
      // If we've already got a :: its an error
      return 0;
    }
    if (s->zero_cnt >= 3) {
      // More than three zeros is an error.
      return 0;
    }
    s->zero_cnt++;
  } else {
    // If more than 4 characters could be final a.b.c.d form
    if (len > 4) {
      // Need at least 4 bytes left
      if (s->total > 12) {
        return 0;
      }
      // Must be end of string
      if (elem[len]) {
        return 0;
      }
      if (!ipv4_from_asc(s->tmp + s->total, elem)) {
        return 0;
      }
      s->total += 4;
    } else {
      if (!ipv6_hex(s->tmp + s->total, elem, len)) {
        return 0;
      }
      s->total += 2;
    }
  }
  return 1;
}